

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

int bus0_sock_set_send_buf_len(void *arg,void *buf,size_t sz,nni_type t)

{
  int local_48;
  int local_44;
  int rv;
  int val;
  bus0_pipe *p;
  bus0_sock *s;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  p = (bus0_pipe *)arg;
  s._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  local_48 = nni_copyin_int(&local_44,buf,sz,1,0x2000,t);
  arg_local._4_4_ = local_48;
  if (local_48 == 0) {
    nni_mtx_lock((nni_mtx *)&(p->send_queue).lmq_alloc);
    (p->aio_recv).a_task.task_mtx.mtx.__data.__lock = local_44;
    _rv = nni_list_first((nni_list *)p);
    while ((_rv != (void *)0x0 &&
           (local_48 = nni_lmq_resize((nni_lmq *)((long)_rv + 0x10),(long)local_44), local_48 == 0))
          ) {
      _rv = nni_list_next((nni_list *)p,_rv);
    }
    nni_mtx_unlock((nni_mtx *)&(p->send_queue).lmq_alloc);
    arg_local._4_4_ = local_48;
  }
  return arg_local._4_4_;
}

Assistant:

static int
bus0_sock_set_send_buf_len(void *arg, const void *buf, size_t sz, nni_type t)
{
	bus0_sock *s = arg;
	bus0_pipe *p;
	int        val;
	int        rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 1, 8192, t)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&s->mtx);
	s->send_buf = val;
	NNI_LIST_FOREACH (&s->pipes, p) {
		// If we fail part way through (should only be ENOMEM), we
		// stop short.  The others would likely fail for ENOMEM as
		// well anyway.  There is a weird effect here where the
		// buffers may have been set for *some* of the pipes, but
		// we have no way to correct partial failure.
		if ((rv = nni_lmq_resize(&p->send_queue, (size_t) val)) != 0) {
			break;
		}
	}
	nni_mtx_unlock(&s->mtx);
	return (rv);
}